

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_alternative_serial.cpp
# Opt level: O1

void test_trace(void)

{
  char *local_58;
  string local_50;
  string local_30;
  
  SpyingSerial::clear(&Serial2);
  local_58 = "test_alternative_serial.cpp";
  SpyingSerial::print<char_const*>(&Serial2,&local_58);
  local_58 = ":15: ";
  SpyingSerial::print<char_const*>(&Serial2,&local_58);
  SpyingSerial::println<char[18]>(&Serial2,(char (*) [18])"void test_trace()");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&Serial2.field_0x10,"flush()\r\n",9)
  ;
  std::__cxx11::stringbuf::str();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "test_alternative_serial.cpp:\\d+: void test_trace\\(\\)\r\nflush\\(\\)\r\n","");
  ASSERT_RE(&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_trace() {
  Serial2.clear();
  TRACE();
  ASSERT_RE(Serial2.log(),
            "test_alternative_serial.cpp:\\d+: void test_trace\\(\\)\r\n"
            "flush\\(\\)\r\n");
}